

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void decompile(Decompiler *decompiler,Image *image,uint64_t time_offset,bool ignore_named_objects)

{
  uint64_t output;
  DebugStream *pDVar1;
  ostringstream decompiled_code;
  undefined1 local_202 [2];
  string local_200 [32];
  string local_1e0;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  output = r_comp::Decompiler::decompile
                     ((Image *)decompiler,(ostringstream *)image,(ulong)local_1a0,
                      SUB81(time_offset,0));
  std::__cxx11::string::string(local_1c0,"main",(allocator *)(local_202 + 1));
  debug((string *)local_202);
  pDVar1 = DebugStream::operator<<((DebugStream *)local_202,"decompilation:\n");
  std::__cxx11::stringbuf::str();
  DebugStream::operator<<(pDVar1,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  DebugStream::~DebugStream((DebugStream *)local_202);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::string(local_200,"main",(allocator *)(local_202 + 1));
  debug((string *)local_202);
  pDVar1 = DebugStream::operator<<((DebugStream *)local_202,output);
  DebugStream::operator<<(pDVar1,"objects");
  DebugStream::~DebugStream((DebugStream *)local_202);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

void decompile(Decompiler &decompiler, r_comp::Image *image, uint64_t time_offset, bool ignore_named_objects)
{
#ifdef DECOMPILE_ONE_BY_ONE
    uint64_t object_count = decompiler.decompile_references(image);
    std::cout << object_count << " objects in the image\n";

    while (1) {
        std::cout << "> which object (-1 to exit)?\n";
        int64_t index;
        std::cin >> index;

        if (index == -1) {
            break;
        }

        if (index >= object_count) {
            std::cout << "> there is only " << object_count << " objects\n";
            continue;
        }

        std::ostringstream decompiled_code;
        decompiler.decompile_object(index, &decompiled_code, time_offset);
        std::cout << "\n\n> DECOMPILATION\n\n" << decompiled_code.str() << std::endl;
    }

#else
    std::ostringstream decompiled_code;
    uint64_t object_count = decompiler.decompile(image, &decompiled_code, time_offset, ignore_named_objects);
    //uint64_t object_count=image->code_segment.objects.size();
    debug("main") << "decompilation:\n" << decompiled_code.str();
    //debug("main") << "image taken at:" << Time::ToString_year(image->timestamp);
    debug("main") << object_count << "objects";
#endif
}